

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O3

bool __thiscall TripleBuffer<stStateCore>::update(TripleBuffer<stStateCore> *this,bool force)

{
  double dVar1;
  TProb TVar2;
  undefined4 uVar3;
  int iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  long lVar7;
  byte bVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  pthread_mutex_t *__mutex;
  byte bVar11;
  int local_44;
  pthread_mutex_t *local_40;
  map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
  *local_38;
  
  bVar11 = 0;
  __mutex = (pthread_mutex_t *)&this->mutex;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    bVar8 = this->hasChanged ^ 1U | force;
    if (bVar8 == 1) {
      this->hasChanged = true;
      local_40 = __mutex;
      memcpy(&this->buffer,this,0x82);
      if ((this->super_stStateCore).flags.updateSimilarityMap == true) {
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::operator=(&(this->buffer).similarityMap,&(this->super_stStateCore).similarityMap);
      }
      local_38 = &(this->super_stStateCore).processors;
      for (local_44 = 0;
          local_44 <
          (int)((ulong)((long)(this->super_stStateCore).params.valuesWEnglishFreq.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->super_stStateCore).params.valuesWEnglishFreq.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) *
          (int)((ulong)((long)(this->super_stStateCore).params.valuesPNonAlphabetic.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->super_stStateCore).params.valuesPNonAlphabetic.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) *
          (int)((ulong)((long)(this->super_stStateCore).params.valuesClusters.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->super_stStateCore).params.valuesClusters.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2); local_44 = local_44 + 1) {
        if ((this->super_stStateCore).flags.updateResult[local_44] == true) {
          pmVar5 = std::
                   map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
                   ::operator[](local_38,&local_44);
          pmVar6 = std::
                   map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
                   ::operator[](&(this->buffer).processors,&local_44);
          pmVar9 = pmVar5;
          pmVar10 = pmVar6;
          for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
            iVar4 = (pmVar9->m_params).maxClusters;
            (pmVar10->m_params).minClusters = (pmVar9->m_params).minClusters;
            (pmVar10->m_params).maxClusters = iVar4;
            pmVar9 = (mapped_type *)((long)pmVar9 + (ulong)bVar11 * -0x10 + 8);
            pmVar10 = (mapped_type *)((long)pmVar10 + (ulong)bVar11 * -0x10 + 8);
          }
          (pmVar6->m_params).similarityMismatchSig = (pmVar5->m_params).similarityMismatchSig;
          std::vector<int,_std::allocator<int>_>::operator=
                    (&(pmVar6->m_params).hint,&(pmVar5->m_params).hint);
          pmVar6->m_freqMap = pmVar5->m_freqMap;
          std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::operator=(&pmVar6->m_similarityMap,&pmVar5->m_similarityMap);
          std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::operator=(&pmVar6->m_logMap,&pmVar5->m_logMap);
          std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::operator=(&pmVar6->m_logMapInv,&pmVar5->m_logMapInv);
          uVar3 = *(undefined4 *)&pmVar5->field_0xcc;
          dVar1 = pmVar5->m_pCur;
          pmVar6->m_nMHInitialIters = pmVar5->m_nMHInitialIters;
          *(undefined4 *)&pmVar6->field_0xcc = uVar3;
          pmVar6->m_pCur = dVar1;
          uVar3 = *(undefined4 *)&(pmVar5->m_curResult).field_0x4;
          TVar2 = (pmVar5->m_curResult).p;
          (pmVar6->m_curResult).id = (pmVar5->m_curResult).id;
          *(undefined4 *)&(pmVar6->m_curResult).field_0x4 = uVar3;
          (pmVar6->m_curResult).p = TVar2;
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::operator=(&(pmVar6->m_curResult).clMap._M_t,&(pmVar5->m_curResult).clMap._M_t);
          std::vector<int,_std::allocator<int>_>::operator=
                    (&(pmVar6->m_curResult).clusters,&(pmVar5->m_curResult).clusters);
        }
      }
      memset(this,0,0x82);
      __mutex = local_40;
    }
    pthread_mutex_unlock(__mutex);
    return (bool)bVar8;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

bool TripleBuffer<stStateCore>::update(bool force) {
    std::lock_guard<std::mutex> lock(mutex);
    if (hasChanged && force == false) return false;

    hasChanged = true;

    buffer.flags = this->flags;

    if (this->flags.updateSimilarityMap) {
        buffer.similarityMap = this->similarityMap;
    }

    for (int i = 0; i < this->params.nProcessors(); ++i) {
        if (this->flags.updateResult[i]) {
            buffer.processors[i] = this->processors[i];
        }
    }

    this->flags.clear();

    return true;
}